

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O3

string * __thiscall
HPresolve::getDualsForcingRow_abi_cxx11_
          (string *__return_storage_ptr__,HPresolve *this,int row,
          vector<int,_std::allocator<int>_> *fRjs)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  pointer piVar5;
  pointer piVar6;
  pointer pdVar7;
  pointer pdVar8;
  int iVar9;
  pointer piVar10;
  ostream *poVar11;
  pointer pdVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  _Elt_pointer ppVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  double dVar25;
  double up;
  double lo;
  vector<double,_std::allocator<double>_> v;
  pair<int,_std::vector<double,_std::allocator<double>_>_> p;
  stringstream ss;
  pointer local_218;
  double local_210;
  double local_208;
  KktChStep *local_200;
  pointer local_1f8;
  vector<double,_std::allocator<double>_> local_1f0;
  int local_1d8;
  vector<double,_std::allocator<double>_> local_1d0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  local_208 = -1e+200;
  local_210 = 1e+200;
  piVar10 = (fRjs->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start;
  if ((fRjs->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish == piVar10) {
LAB_001489c1:
    pdVar12 = (this->super_HPreData).valueRowDual.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start;
    if ((ulong)((long)(this->super_HPreData).valueRowDual.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pdVar12 >> 3) <= (ulong)(long)row)
    goto LAB_00148d1b;
    pdVar12[row] = 0.0;
  }
  else {
    uVar16 = 0;
    do {
      ppVar20 = (this->super_HPreData).oldBounds.c.
                super__Deque_base<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (ppVar20 ==
          *(_Elt_pointer *)
           ((long)&(this->super_HPreData).oldBounds.c.
                   super__Deque_base<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish + 8)) {
        ppVar20 = (*(_Map_pointer *)
                    ((long)&(this->super_HPreData).oldBounds.c.
                            super__Deque_base<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish + 0x18))[-1] + 0x10;
      }
      iVar2 = piVar10[uVar16];
      local_1d8 = ppVar20[-1].first;
      std::vector<double,_std::allocator<double>_>::vector(&local_1d0,&ppVar20[-1].second);
      std::vector<double,_std::allocator<double>_>::vector(&local_1f0,&local_1d0);
      std::
      deque<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>
      ::pop_back(&(this->super_HPreData).oldBounds.c);
      getBoundOnLByZj(this,row,iVar2,&local_208,&local_210,
                      *local_1f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start,
                      local_1f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[1]);
      if (local_1f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (double *)0x0) {
        operator_delete(local_1f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_1d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      dVar25 = local_208;
      dVar1 = local_210;
      uVar16 = uVar16 + 1;
      piVar10 = (fRjs->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar16 < (ulong)((long)(fRjs->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                    super__Vector_impl_data._M_finish - (long)piVar10 >> 2));
    if (local_210 < local_208) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"PR: Error in postsolving forcing row ",0x25);
      poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,row);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar11," : inconsistent bounds for it\'s dual value.\n",0x2c);
    }
    if ((dVar25 <= 0.0) && (0.0 <= dVar1)) goto LAB_001489c1;
    if (dVar25 <= 0.0) {
      if (dVar1 < 0.0) {
        pdVar12 = (this->super_HPreData).valueRowDual.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        dVar25 = dVar1;
        if ((ulong)((long)(this->super_HPreData).valueRowDual.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)pdVar12 >> 3) <=
            (ulong)(long)row) goto LAB_00148d1b;
        goto LAB_00148a4e;
      }
    }
    else {
      pdVar12 = (this->super_HPreData).valueRowDual.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
      if ((ulong)((long)(this->super_HPreData).valueRowDual.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)pdVar12 >> 3) <= (ulong)(long)row)
      goto LAB_00148d1b;
LAB_00148a4e:
      pdVar12[row] = dVar25;
    }
  }
  piVar10 = (this->super_HPreData).flagRow.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((ulong)(long)row <
      (ulong)((long)(this->super_HPreData).flagRow.super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)piVar10 >> 2)) {
    piVar10[row] = 1;
    piVar10 = (fRjs->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
              _M_start;
    local_218 = (fRjs->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    if (local_218 != piVar10) {
      local_200 = &(this->super_HPreData).chk;
      uVar16 = 0;
      do {
        iVar2 = piVar10[uVar16];
        uVar18 = (ulong)iVar2;
        pdVar12 = (this->super_HPreData).valueColDual.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if ((ulong)((long)(this->super_HPreData).valueColDual.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)pdVar12 >> 3) <= uVar18) {
LAB_00148d0a:
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar18);
        }
        piVar5 = (this->super_HPreData).Astart.super__Vector_base<int,_std::allocator<int>_>._M_impl
                 .super__Vector_impl_data._M_start;
        uVar14 = (long)(this->super_HPreData).Astart.super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)piVar5 >> 2;
        uVar19 = uVar18;
        if (uVar14 <= uVar18) {
LAB_00148cf9:
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar19,uVar14);
        }
        piVar6 = (this->super_HPreData).Aend.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar14 = (long)(this->super_HPreData).Aend.super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)piVar6 >> 2;
        local_1f8 = piVar10;
        if (uVar14 <= uVar18) goto LAB_00148cf9;
        dVar1 = pdVar12[uVar18];
        iVar3 = piVar5[uVar18];
        uVar13 = (ulong)iVar3;
        iVar4 = piVar6[uVar18];
        dVar25 = 0.0;
        iVar9 = iVar4;
        if (iVar4 < iVar3) {
          iVar9 = iVar3;
        }
        if (iVar3 < iVar4) {
          piVar5 = (this->super_HPreData).Aindex.super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          uVar15 = (long)(this->super_HPreData).Aindex.super__Vector_base<int,_std::allocator<int>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)piVar5 >> 2;
          piVar6 = (this->super_HPreData).flagRow.super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          uVar22 = (long)(this->super_HPreData).flagRow.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)piVar6 >> 2;
          pdVar7 = (this->super_HPreData).valueRowDual.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar23 = (long)(this->super_HPreData).valueRowDual.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)pdVar7 >> 3;
          pdVar8 = (this->super_HPreData).Avalue.super__Vector_base<double,_std::allocator<double>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar24 = (long)(this->super_HPreData).Avalue.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)pdVar8 >> 3;
          uVar21 = uVar13;
          do {
            if (uVar15 <= uVar21) {
              uVar14 = uVar15;
              uVar19 = uVar13;
              if (uVar13 < uVar15) {
                uVar19 = uVar15;
              }
              goto LAB_00148cf9;
            }
            uVar17 = (ulong)piVar5[uVar21];
            uVar14 = uVar22;
            uVar19 = uVar17;
            if (uVar22 <= uVar17) goto LAB_00148cf9;
            if (piVar6[uVar17] != 0) {
              uVar14 = uVar23;
              if ((uVar23 <= uVar17) || (uVar14 = uVar24, uVar19 = uVar21, uVar24 <= uVar21))
              goto LAB_00148cf9;
              dVar25 = dVar25 + pdVar7[uVar17] * pdVar8[uVar21];
            }
            uVar21 = uVar21 + 1;
          } while ((long)iVar9 != uVar21);
        }
        pdVar12[uVar18] = dVar25 + dVar1;
        if (this->iKKTcheck == 1) {
          std::ostream::operator<<(local_1a8,iVar2);
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8," ",1);
          pdVar12 = (this->super_HPreData).valuePrimal.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if (((ulong)((long)(this->super_HPreData).valuePrimal.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish - (long)pdVar12 >> 3) <= uVar18) ||
             (pdVar7 = (this->super_HPreData).valueColDual.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start,
             (ulong)((long)(this->super_HPreData).valueColDual.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish - (long)pdVar7 >> 3) <= uVar18))
          goto LAB_00148d0a;
          KktChStep::addChange(local_200,2,0,iVar2,pdVar12[uVar18],pdVar7[uVar18],dVar1);
          piVar10 = (fRjs->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          local_218 = (fRjs->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish;
        }
        uVar16 = uVar16 + 1;
      } while (uVar16 < (ulong)((long)local_218 - (long)piVar10 >> 2));
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base(local_138);
    return __return_storage_ptr__;
  }
LAB_00148d1b:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

string HPresolve::getDualsForcingRow( int row, vector<int>& fRjs) {
	double z;
	stringstream ss;
	int j;

	double lo = -HSOL_CONST_INF;
	double up = HSOL_CONST_INF;

	double cost, sum;

	for (size_t jj=0;jj<fRjs.size();++jj) {
			j = fRjs[jj];

			pair<int, vector<double> > p = oldBounds.top();
			vector<double> v = get<1>(p);
			oldBounds.pop();
			double colLow = v[0];
			double colUpp = v[1];


			//calculate bound x imposed by zj
			getBoundOnLByZj(row, j, &lo, &up, colLow, colUpp);
		}

	//calculate yi
	if (lo>up)
		cout<<"PR: Error in postsolving forcing row "<<row <<" : inconsistent bounds for it's dual value.\n";

	if (lo<=0 && up>=0) {
		valueRowDual.at(row) = 0;
	}
	else if (lo>0) {
		valueRowDual.at(row) = lo;
	}
	else if (up<0) {
		valueRowDual.at(row) = up;
	}

	flagRow.at(row) = 1;


	for (size_t jj=0;jj<fRjs.size();++jj) {
			j = fRjs[jj];
			cost = valueColDual.at(j);
			sum = 0;
			for (int k=Astart.at(j); k<Aend.at(j);++k )
				if (flagRow.at(Aindex.at(k))) {
					sum = sum + valueRowDual.at(Aindex.at(k))*Avalue.at(k);
					//cout<<" row "<<Aindex.at(k)<<" dual "<<valueRowDual.at(Aindex.at(k))<<" a_"<<Aindex.at(k)<<"_"<<j<<"\n";
				}
			z = cost + sum;

			valueColDual.at(j) = z;

			if (iKKTcheck == 1) {
				ss<<j;
				ss<<" ";
				chk.addChange(2, 0, j, valuePrimal.at(j), valueColDual.at(j), cost);
			}
		}

	return ss.str();
}